

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::ValueNumberTransferDstInPrepass(GlobOpt *this,Instr *instr,Value *src1Val)

{
  ValueInfo *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  bool local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  bool isSafeToTransferInPrepass;
  ValueType valueType;
  
  if (src1Val == (Value *)0x0) {
    return (Value *)0x0;
  }
  this_00 = src1Val->valueInfo;
  pVVar4 = (Value *)&local_33;
  local_33 = false;
  bVar2 = IsPrepassSrcValueInfoPrecise(this,instr,src1Val,(Value *)0x0,(bool *)pVVar4);
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       GetPrepassValueTypeForDst
                 (this,*(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_00->super_ValueType).field_0.field_0,instr,(Value *)(ulong)local_33,
                  pVVar4,bVar2,local_33);
  if ((bVar2) || (local_33 == true)) {
    bVar2 = ValueType::operator==
                      ((ValueType *)&local_32[0].field_0,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_00->super_ValueType).field_0.field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x173a,"(valueType == src1ValueInfo->Type())",
                         "valueType == src1ValueInfo->Type()");
      if (!bVar2) goto LAB_0045521e;
      *puVar3 = 0;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,AVTInPrePassPhase);
    if (!bVar2) {
      return src1Val;
    }
  }
  else {
    bVar2 = ValueType::operator==
                      ((ValueType *)&local_32[0].field_0,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_00->super_ValueType).field_0.field_0);
    if ((!bVar2) || (bVar2 = ValueInfo::IsGeneric(this_00), !bVar2)) {
      pVVar4 = NewGenericValue(this,(ValueType)local_32[0].field_0,(Opnd *)0x0);
      ValueInfo::SetSymStore(pVVar4->valueInfo,this_00->symStore);
      return pVVar4;
    }
    bVar2 = ValueType::operator==
                      ((ValueType *)&local_32[0].field_0,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_00->super_ValueType).field_0.field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1747,"(valueType == src1ValueInfo->Type())",
                         "valueType == src1ValueInfo->Type()");
      if (!bVar2) {
LAB_0045521e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  pVVar4 = CopyValue(this,src1Val);
  TrackCopiedValueForKills(this,pVVar4);
  return pVVar4;
}

Assistant:

Value *
GlobOpt::ValueNumberTransferDstInPrepass(IR::Instr *const instr, Value *const src1Val)
{
    Value *dstVal = nullptr;

    if (!src1Val)
    {
        return nullptr;
    }

    bool isValueInfoPrecise;
    ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();

    // TODO: This conflicts with new values created by the type specialization code
    //       We should re-enable if we change that code to avoid the new values.
#if 0
    if (this->IsSafeToTransferInPrePass(instr->GetSrc1(), src1Val))
    {
        return src1Val;
    }


    if (this->IsPREInstrCandidateLoad(instr->m_opcode) && instr->GetDst())
    {
        StackSym *dstSym = instr->GetDst()->AsRegOpnd()->m_sym;

        for (Loop *curLoop = this->currentBlock->loop; curLoop; curLoop = curLoop->parent)
        {
            if (curLoop->fieldPRESymStore->Test(dstSym->m_id))
            {
                return src1Val;
            }
        }
    }

    if (instr->GetDst()->IsRegOpnd())
    {
        StackSym *stackSym = instr->GetDst()->AsRegOpnd()->m_sym;

        if (stackSym->IsSingleDef() || this->IsLive(stackSym, this->prePassLoop->landingPad))
        {
            IntConstantBounds src1IntConstantBounds;
            if (src1ValueInfo->TryGetIntConstantBounds(&src1IntConstantBounds) &&
                !(
                    src1IntConstantBounds.LowerBound() == INT32_MIN &&
                    src1IntConstantBounds.UpperBound() == INT32_MAX
                    ))
            {
                const ValueType valueType(
                    GetPrepassValueTypeForDst(src1ValueInfo->Type(), instr, src1Val, nullptr, &isValueInfoPrecise));
                if (isValueInfoPrecise)
                {
                    return src1Val;
                }
            }
            else
            {
                return src1Val;
            }
        }
    }
#endif

    // Src1's value could change later in the loop, so the value wouldn't be the same for each
    // iteration.  Since we don't iterate over loops "while (!changed)", go conservative on the
    // first pass when transferring a value that is live on the back-edge.

    // In prepass we are going to copy the value but with a different value number
    // for aggressive int type spec.
    bool isSafeToTransferInPrepass = false;
    isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Val, nullptr, &isSafeToTransferInPrepass);
    
    const ValueType valueType(GetPrepassValueTypeForDst(src1ValueInfo->Type(), instr, src1Val, nullptr, isValueInfoPrecise, isSafeToTransferInPrepass));
    if(isValueInfoPrecise || isSafeToTransferInPrepass)
    {
        Assert(valueType == src1ValueInfo->Type());
        if (!PHASE_OFF1(Js::AVTInPrePassPhase))
        {
            dstVal = src1Val;
        }
        else
        {
            dstVal = CopyValue(src1Val);
            TrackCopiedValueForKills(dstVal);
        }
    }
    else if (valueType == src1ValueInfo->Type() && src1ValueInfo->IsGeneric()) // this else branch is probably not needed
    {
        Assert(valueType == src1ValueInfo->Type());
        dstVal = CopyValue(src1Val);
        TrackCopiedValueForKills(dstVal);
    }
    else
    {
        dstVal = NewGenericValue(valueType);
        dstVal->GetValueInfo()->SetSymStore(src1ValueInfo->GetSymStore());
    }

    return dstVal;
}